

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall cppjieba::Trie::DeleteNode(Trie *this,TrieNode *node)

{
  unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
  *this_00;
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_20;
  iterator it;
  TrieNode *node_local;
  Trie *this_local;
  
  if (node != (TrieNode *)0x0) {
    it.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>)node;
    if (node->next != (NextMap *)0x0) {
      local_20._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::begin(node->next);
      while( true ) {
        local_28._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
             ::end(*(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                     **)it.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                        ._M_cur);
        bVar1 = std::__detail::operator!=(&local_20,&local_28);
        if (!bVar1) break;
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                             *)&local_20);
        DeleteNode(this,ppVar2->second);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                    *)&local_20);
      }
      this_00 = *(unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                  **)it.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                     ._M_cur;
      if (this_00 !=
          (unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           *)0x0) {
        std::
        unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
        ::~unordered_map(this_00);
        operator_delete(this_00);
      }
    }
    if (it.super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
        _M_cur != (__node_type *)0x0) {
      operator_delete((void *)it.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                              ._M_cur);
    }
  }
  return;
}

Assistant:

void DeleteNode(TrieNode* node) {
    if (NULL == node) {
      return;
    }
    if (NULL != node->next) {
      for (TrieNode::NextMap::iterator it = node->next->begin(); it != node->next->end(); ++it) {
        DeleteNode(it->second);
      }
      delete node->next;
    }
    delete node;
  }